

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

void __thiscall tcu::DirArchive::DirArchive(DirArchive *this,char *path)

{
  long lVar1;
  char *pcVar2;
  allocator<char> local_19;
  char *local_18;
  char *path_local;
  DirArchive *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  Archive::Archive(&this->super_Archive);
  pcVar2 = local_18;
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__DirArchive_00cc0870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_path,pcVar2,&local_19);
  std::allocator<char>::~allocator(&local_19);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::__cxx11::string::length();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_path);
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)&this->m_path,"/");
    }
  }
  return;
}

Assistant:

DirArchive::DirArchive (const char* path)
	: m_path(path)
{
	// Append leading / if necessary
	if (m_path.length() > 0 && m_path[m_path.length()-1] != '/')
		m_path += "/";
}